

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcG.c
# Opt level: O0

Cnf_Dat_t * Bmcg_ManAddNewCnf(Bmcg_Man_t *p,int f,int nFramesAdd)

{
  uint i_00;
  int iVar1;
  abctime aVar2;
  Gia_Man_t *pGia;
  abctime aVar3;
  int *pMap_00;
  bool bVar4;
  int *pMap;
  int iVar;
  int i;
  Gia_Obj_t *pObj;
  Cnf_Dat_t *pCnf;
  Gia_Man_t *pNew;
  abctime clk;
  int nFramesAdd_local;
  int f_local;
  Bmcg_Man_t *p_local;
  
  aVar2 = Abc_Clock();
  pGia = Bmcg_ManUnfold(p,f,nFramesAdd);
  aVar3 = Abc_Clock();
  p->timeUnf = (aVar3 - aVar2) + p->timeUnf;
  if (pGia == (Gia_Man_t *)0x0) {
    p_local = (Bmcg_Man_t *)0x0;
  }
  else {
    aVar2 = Abc_Clock();
    p_local = (Bmcg_Man_t *)Mf_ManGenerateCnf(pGia,8,1,0,0,0);
    iVar1 = Gia_ManObjNum(pGia);
    pMap_00 = (int *)malloc((long)iVar1 << 2);
    iVar1 = Gia_ManObjNum(pGia);
    memset(pMap_00,0xff,(long)iVar1 << 2);
    *pMap_00 = 0;
    pMap._4_4_ = 1;
    while( true ) {
      bVar4 = false;
      if (pMap._4_4_ < pGia->nObjs) {
        _iVar = Gia_ManObj(pGia,pMap._4_4_);
        bVar4 = _iVar != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      if ((0 < *(int *)(*(long *)&p_local->vFr2Sat + (long)pMap._4_4_ * 4)) ||
         (iVar1 = Gia_ObjIsCi(_iVar), iVar1 != 0)) {
        pMap._0_4_ = Vec_IntEntry(&p->vFr2Sat,_iVar->Value);
        if ((int)pMap == -1) {
          i_00 = _iVar->Value;
          pMap._0_4_ = p->nSatVars;
          p->nSatVars = (int)pMap + 1;
          Vec_IntWriteEntry(&p->vFr2Sat,i_00,(int)pMap);
        }
        pMap_00[pMap._4_4_] = (int)pMap;
      }
      pMap._4_4_ = pMap._4_4_ + 1;
    }
    Gia_ManStop(pGia);
    for (pMap._4_4_ = 0; pMap._4_4_ < *(int *)((long)&p_local->pGia + 4);
        pMap._4_4_ = pMap._4_4_ + 1) {
      iVar1 = Abc_Lit2LitV(pMap_00,*(int *)(p_local->pClean->pName + (long)pMap._4_4_ * 4));
      *(int *)(p_local->pClean->pName + (long)pMap._4_4_ * 4) = iVar1;
    }
    if (pMap_00 != (int *)0x0) {
      free(pMap_00);
    }
    aVar3 = Abc_Clock();
    p->timeCnf = (aVar3 - aVar2) + p->timeCnf;
  }
  return (Cnf_Dat_t *)p_local;
}

Assistant:

Cnf_Dat_t * Bmcg_ManAddNewCnf( Bmcg_Man_t * p, int f, int nFramesAdd )
{
    abctime clk = Abc_Clock();
    Gia_Man_t * pNew = Bmcg_ManUnfold( p, f, nFramesAdd );
    Cnf_Dat_t * pCnf;
    Gia_Obj_t * pObj; 
    int i, iVar, * pMap;
    p->timeUnf += Abc_Clock() - clk;
    if ( pNew == NULL )
        return NULL;
    clk = Abc_Clock();
    pCnf = (Cnf_Dat_t *) Mf_ManGenerateCnf( pNew, 8, 1, 0, 0, 0 );
    pMap = ABC_FALLOC( int, Gia_ManObjNum(pNew) );
    pMap[0] = 0;
    Gia_ManForEachObj1( pNew, pObj, i )
    {
        if ( pCnf->pObj2Count[i] <= 0 && !Gia_ObjIsCi(pObj) )
            continue;
        iVar = Vec_IntEntry( &p->vFr2Sat, pObj->Value );
        if ( iVar == -1 )
            Vec_IntWriteEntry( &p->vFr2Sat, pObj->Value, (iVar = p->nSatVars++) );
        pMap[i] = iVar;
    }
    Gia_ManStop( pNew );
    for ( i = 0; i < pCnf->nLiterals; i++ )
        pCnf->pClauses[0][i] = Abc_Lit2LitV( pMap, pCnf->pClauses[0][i] );
    ABC_FREE( pMap );
    p->timeCnf += Abc_Clock() - clk;
    return pCnf;
}